

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall
SM_Manager::CreateTable(SM_Manager *this,char *relName,int attrCount,AttrInfo *attributes)

{
  AttrType AVar1;
  SM_Manager *__s;
  undefined8 uVar2;
  AttrInfo *pAVar3;
  bool bVar4;
  RC RVar5;
  RC RVar6;
  ostream *poVar7;
  size_t sVar8;
  iterator iVar9;
  ulong uVar10;
  long lVar11;
  key_type *pkVar12;
  char *pcVar13;
  SM_Manager *this_00;
  ulong uVar14;
  AttrType *pAVar15;
  int *piVar16;
  int offset;
  AttrInfo attribute;
  AttrInfo attr;
  int local_b0;
  allocator local_a9;
  SM_Manager *local_a8;
  char *local_a0;
  ulong local_98;
  long local_90;
  AttrInfo *local_88;
  RID rid;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relAttributes;
  
  local_a8 = this;
  poVar7 = std::operator<<((ostream *)&std::cout,"CreateTable\n");
  poVar7 = std::operator<<(poVar7,"   relName     =");
  local_a0 = relName;
  poVar7 = std::operator<<(poVar7,relName);
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"   attrCount   =");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,attrCount);
  pkVar12 = (key_type *)0x119085;
  std::operator<<(poVar7,"\n");
  uVar14 = 0;
  uVar10 = 0;
  if (0 < attrCount) {
    uVar10 = (ulong)(uint)attrCount;
  }
  local_90 = CONCAT44(local_90._4_4_,attrCount);
  local_98 = (ulong)(uint)attrCount;
  piVar16 = &attributes->attrLength;
  local_88 = attributes;
  for (; uVar10 != uVar14; uVar14 = uVar14 + 1) {
    poVar7 = std::operator<<((ostream *)&std::cout,"   attributes[");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar14);
    poVar7 = std::operator<<(poVar7,"].attrName=");
    poVar7 = std::operator<<(poVar7,((AttrInfo *)(piVar16 + -3))->attrName);
    poVar7 = std::operator<<(poVar7,"   attrType=");
    AVar1 = piVar16[-1];
    pcVar13 = "INT";
    if (AVar1 != INT) {
      if (AVar1 == MBR) {
        pcVar13 = "MBR";
      }
      else {
        pcVar13 = "STRING";
        if (AVar1 == FLOAT) {
          pcVar13 = "FLOAT";
        }
      }
    }
    poVar7 = std::operator<<(poVar7,pcVar13);
    poVar7 = std::operator<<(poVar7,"   attrLength=");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,*piVar16);
    pkVar12 = (key_type *)0x119085;
    std::operator<<(poVar7,"\n");
    piVar16 = piVar16 + 4;
  }
  relAttributes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &relAttributes._M_t._M_impl.super__Rb_tree_header._M_header;
  relAttributes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  relAttributes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  relAttributes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  relAttributes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       relAttributes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)local_90 - 0x29U < 0xffffffd8) {
    puts("reaches here");
LAB_00106de4:
    RVar6 = 0x12f;
  }
  else {
    sVar8 = strlen(local_a0);
    RVar6 = 0x12e;
    if (sVar8 < 0x19) {
      local_90 = local_98 << 4;
      local_b0 = 0;
      RVar6 = 0x130;
      for (lVar11 = 0; pAVar3 = local_88, local_90 != lVar11; lVar11 = lVar11 + 0x10) {
        __s = *(SM_Manager **)((long)&local_88->attrName + lVar11);
        this_00 = __s;
        sVar8 = strlen((char *)__s);
        if (0x18 < sVar8) goto LAB_00106e02;
        uVar2 = *(undefined8 *)((long)&pAVar3->attrType + lVar11);
        attribute.attrType = (int)uVar2;
        attribute.attrLength = (int)((ulong)uVar2 >> 0x20);
        attribute.attrName = (char *)pkVar12;
        bVar4 = isValidAttrType(this_00,attribute);
        if (!bVar4) goto LAB_00106e02;
        std::__cxx11::string::string((string *)&rid,(char *)__s,&local_a9);
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&relAttributes,(key_type *)&rid);
        if ((_Rb_tree_header *)iVar9._M_node != &relAttributes._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::string::~string((string *)&rid);
          goto LAB_00106de4;
        }
        pkVar12 = (key_type *)&rid;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&relAttributes,(key_type *)&rid);
        local_b0 = local_b0 + (int)((ulong)uVar2 >> 0x20);
        std::__cxx11::string::~string((string *)&rid);
      }
      RVar5 = RM_Manager::CreateFile(local_a8->rmm,local_a0,local_b0);
      RVar6 = 0x12e;
      if (RVar5 == 0) {
        RID::RID(&rid);
        pAVar15 = &local_88->attrType;
        offset = 0;
        for (uVar10 = 0; local_98 != uVar10; uVar10 = uVar10 + 1) {
          uVar2 = *(undefined8 *)pAVar15;
          attr.attrType = (int)uVar2;
          attr.attrLength = (int)((ulong)uVar2 >> 0x20);
          attr.attrName = ((AttrInfo *)(pAVar15 + -2))->attrName;
          RVar6 = InsertAttrCat(local_a8,local_a0,attr,offset,(int)uVar10);
          if (RVar6 != 0) goto LAB_00106f99;
          offset = offset + (int)((ulong)uVar2 >> 0x20);
          pAVar15 = pAVar15 + 4;
        }
        RVar6 = InsertRelCat(local_a8,local_a0,(int)local_98,local_b0);
        if (RVar6 == 0) {
          RVar6 = RM_FileHandle::ForcePages(&local_a8->attrcatFH,-1);
          if (RVar6 == 0) {
            RVar6 = RM_FileHandle::ForcePages(&local_a8->relcatFH,-1);
          }
        }
LAB_00106f99:
        RID::~RID(&rid);
      }
    }
  }
LAB_00106e02:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&relAttributes._M_t);
  return RVar6;
}

Assistant:

RC SM_Manager::CreateTable(const char *relName,
                           int        attrCount,
                           AttrInfo   *attributes)
{
  cout << "CreateTable\n"
    << "   relName     =" << relName << "\n"
    << "   attrCount   =" << attrCount << "\n";
  for (int i = 0; i < attrCount; i++)
    cout << "   attributes[" << i << "].attrName=" << attributes[i].attrName
        << "   attrType="
        << (attributes[i].attrType == INT ? "INT" :
            attributes[i].attrType == MBR ? "MBR" :
            attributes[i].attrType == FLOAT ? "FLOAT" : "STRING")
        << "   attrLength=" << attributes[i].attrLength << "\n";

  RC rc = 0;
  set<string> relAttributes;

  // Check for appropraite # of attributes
  if(attrCount > MAXATTRS || attrCount < 1){
    printf("reaches here\n");
    return (SM_BADREL);
  }
  if(strlen(relName) > MAXNAME) // Check for valid relName size
    return (SM_BADRELNAME);

  // Check the attribute specifications
  int totalRecSize = 0;
  for(int i = 0; i < attrCount; i++){
    if(strlen(attributes[i].attrName) > MAXNAME) // check name size
      return (SM_BADATTR);
    if(! isValidAttrType(attributes[i])) // check type
      return (SM_BADATTR);
    totalRecSize += attributes[i].attrLength; 
    string attrString(attributes[i].attrName); // check attribute dups
    bool exists = (relAttributes.find(attrString) != relAttributes.end());
    if(exists)
      return (SM_BADREL);
    else
      relAttributes.insert(attrString);
  }

  // Passed error check. Now information in relcat and attrcat

  // Create a file for this relation. This will check for duplicate tables
  // of the same name.
  if((rc = rmm.CreateFile(relName, totalRecSize)))
    return (SM_BADRELNAME);

  // For each attribute, insert into attrcat:
  RID rid;
  int currOffset = 0;
  for(int i = 0; i < attrCount; i++){
    AttrInfo attr = attributes[i];
    if((rc = InsertAttrCat(relName, attr, currOffset, i)))
      return (rc);
    currOffset += attr.attrLength;
  }
    
  // Insert into RelCat
  if((rc = InsertRelCat(relName, attrCount, totalRecSize)))
    return (rc);

  // Make sure changes to attrcat and relcat are reflected
  if((rc = attrcatFH.ForcePages()) || (rc = relcatFH.ForcePages()))
    return (rc);

  return (0);
}